

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

iterator __thiscall
r_code::list<r_exec::MDLController::REntry>::erase
          (list<r_exec::MDLController::REntry> *this,iterator *i)

{
  int64_t c;
  iterator *i_local;
  list<r_exec::MDLController::REntry> *this_local;
  
  c = _erase(this,(i->super__iterator)._cell);
  iterator::iterator((iterator *)&this_local,this,c);
  return _this_local;
}

Assistant:

iterator erase(iterator &i)
    {
        return iterator(this, _erase(i._cell)); // no check for i._cell==null.
    }